

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_version_details.c
# Opt level: O3

char * archive_libiconv_version(void)

{
  return (char *)0x0;
}

Assistant:

const char *
archive_libiconv_version(void)
{
#if HAVE_LIBCHARSET && HAVE_ICONV_H
	char major = _libiconv_version >> 8;
	char minor = _libiconv_version & 0xFF
	static char charset_version[6];
	snprintf(charset_version, 6, "%hhd.%hhd", major, minor);
	return charset_version;
#else
	return NULL;
#endif
}